

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

map_index_t __thiscall
google::protobuf::internal::KeyMapBase<unsigned_int>::BucketNumber
          (KeyMapBase<unsigned_int> *this,ViewType k)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  map_index_t mVar5;
  map_index_t extraout_EAX;
  map_index_t extraout_EAX_00;
  undefined4 uVar6;
  undefined4 extraout_EAX_01;
  map_index_t extraout_EAX_02;
  undefined8 *puVar7;
  MixingHashState MVar8;
  string *psVar9;
  TreeIterator *it;
  NodeBase *node;
  ulong *extraout_RDX;
  Arena *pAVar10;
  uint uVar11;
  string *psVar13;
  ulong *puVar14;
  UntypedMapBase *pUVar15;
  KeyMapBase<unsigned_int> *this_00;
  TableEntryPtr *pTVar16;
  NodeAndBucket NVar17;
  UntypedMapBase UStack_b0;
  ulong uStack_90;
  TableEntryPtr aTStack_80 [2];
  Arena *pAStack_70;
  UntypedMapBase *pUStack_68;
  KeyMapBase<unsigned_int> KStack_60;
  string *psStack_40;
  ulong uVar12;
  
  pUVar15 = (UntypedMapBase *)&stack0xffffffffffffffc8;
  it = (TreeIterator *)(ulong)k;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)&absl::lts_20240722::hash_internal::MixingHashState::kSeed +
                 (ulong)((this->super_UntypedMapBase).seed_ ^ k);
  uVar11 = (this->super_UntypedMapBase).num_buckets_ - 1 &
           (SUB164(auVar2 * ZEXT816(0x9ddfea08eb382d69),8) ^
           SUB164(auVar2 * ZEXT816(0x9ddfea08eb382d69),0));
  uVar12 = (ulong)uVar11;
  psVar9 = (string *)0x0;
  psStack_40 = (string *)0x15ffa9;
  mVar5 = UntypedMapBase::VariantBucketNumber
                    (&this->super_UntypedMapBase,(VariantKey)(ZEXT416(k) << 0x40));
  if (uVar11 != mVar5) {
    psStack_40 = (string *)0x15ffe9;
    psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((ulong)uVar11,(ulong)mVar5,
                        "VariantBucketNumber(RealKeyToVariantKeyAlternative<Key>{}(k)) == VariantBucketNumber(RealKeyToVariantKey<Key>{}(k))"
                       );
  }
  if (psVar9 == (string *)0x0) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)&absl::lts_20240722::hash_internal::MixingHashState::kSeed +
                   (ulong)(k ^ (this->super_UntypedMapBase).seed_);
    return (SUB164(auVar3 * ZEXT816(0x9ddfea08eb382d69),0) ^
           SUB164(auVar3 * ZEXT816(0x9ddfea08eb382d69),8)) &
           (this->super_UntypedMapBase).num_buckets_ - 1;
  }
  psStack_40 = (string *)0x15fff9;
  psVar13 = psVar9;
  BucketNumber();
  this_00 = &KStack_60;
  pAVar10 = (Arena *)((ulong)psVar13 & 0xffffffff);
  KStack_60.super_UntypedMapBase.table_ = (TableEntryPtr *)this;
  KStack_60.super_UntypedMapBase.alloc_.arena_ = (Arena *)(ulong)k;
  psStack_40 = psVar9;
  if ((pUVar15->index_of_first_non_null_ == pUVar15->num_buckets_) ||
     (it = (TreeIterator *)pUVar15->table_, psVar9 = psVar13,
     (&it->node_)[pUVar15->index_of_first_non_null_] !=
     (btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
      *)0x0)) {
    psVar9 = (string *)(ulong)*(uint *)&node[1].next;
    pUStack_68 = (UntypedMapBase *)0x160030;
    NVar17 = FindHelper((KeyMapBase<unsigned_int> *)pUVar15,*(uint *)&node[1].next,
                        (TreeIterator *)0x0);
    if (NVar17.node == (NodeBase *)0x0) {
      mVar5 = (map_index_t)psVar13;
      if (pUVar15->table_[(long)pAVar10] == 0) {
        pUStack_68 = (UntypedMapBase *)0x160080;
        UntypedMapBase::InsertUniqueInList(pUVar15,mVar5,node);
        uVar11 = pUVar15->index_of_first_non_null_;
        if (uVar11 < mVar5) {
          mVar5 = uVar11;
        }
        pUVar15->index_of_first_non_null_ = mVar5;
        return uVar11;
      }
      if ((pUVar15->table_[(long)pAVar10] & 1) == 0) {
        pUStack_68 = (UntypedMapBase *)0x160052;
        bVar4 = UntypedMapBase::TableEntryIsTooLong(pUVar15,mVar5);
        if (!bVar4) {
          UntypedMapBase::InsertUniqueInList(pUVar15,mVar5,node);
          return extraout_EAX_00;
        }
      }
      UntypedMapBase::InsertUniqueInTree(pUVar15,mVar5,NodeToVariantKey,node);
      return extraout_EAX;
    }
    pUStack_68 = (UntypedMapBase *)0x1600b5;
    InsertUnique(&KStack_60);
  }
  pUStack_68 = (UntypedMapBase *)0x1600bd;
  InsertUnique(&KStack_60);
  uVar11 = (this_00->super_UntypedMapBase).num_buckets_ - 1 & *(uint *)psVar9;
  *(uint *)psVar9 = uVar11;
  pAStack_70 = pAVar10;
  pUStack_68 = pUVar15;
  if (((ulong)extraout_RDX & 1) != 0) {
    pTVar16 = aTStack_80;
    uStack_90 = 0x16013d;
    revalidate_if_necessary();
    pUVar15 = &UStack_b0;
    UStack_b0.alloc_.arena_ = pAVar10;
    uStack_90 = uVar12;
    if (*(int *)((long)pTVar16 + 4) == 1) {
      pbVar1 = (byte *)((long)pTVar16 + 0xc);
      pbVar1[0] = 2;
      pbVar1[1] = 0;
      pbVar1[2] = 0;
      pbVar1[3] = 0;
      pbVar1 = (byte *)((long)pTVar16 + 4);
      pbVar1[0] = 2;
      pbVar1[1] = 0;
      pbVar1[2] = 0;
      pbVar1[3] = 0;
      if ((Arena *)pTVar16[3] == (Arena *)0x0) {
        puVar7 = (undefined8 *)operator_new(0x10);
      }
      else {
        puVar7 = (undefined8 *)Arena::AllocateForArray((Arena *)pTVar16[3],0x10);
      }
      *puVar7 = 0;
      puVar7[1] = 0;
      pTVar16[2] = (TableEntryPtr)puVar7;
      UStack_b0._0_8_ = rdtsc();
      UStack_b0.table_ = pTVar16;
      MVar8 = absl::lts_20240722::hash_internal::
              HashStateBase<absl::lts_20240722::hash_internal::MixingHashState>::
              combine<unsigned_long,google::protobuf::internal::TableEntryPtr*,void_const*>
                        ((MixingHashState)&absl::lts_20240722::hash_internal::MixingHashState::kSeed
                         ,(unsigned_long *)&UStack_b0,(TableEntryPtr **)(pTVar16 + 2),
                         &UStack_b0.table_);
      uVar6 = (undefined4)MVar8.state_;
      *(undefined4 *)(pTVar16 + 1) = uVar6;
    }
    else {
      if ((uint)psVar9 < 2) {
        psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           ((ulong)psVar9 & 0xffffffff,2,"new_num_buckets >= kMinTableSize");
      }
      else {
        psVar9 = (string *)0x0;
      }
      if (psVar9 != (string *)0x0) {
        Resize();
        do {
          psVar13 = *(string **)psVar9;
          mVar5 = BucketNumber((KeyMapBase<unsigned_int> *)pUVar15,*(ViewType *)(psVar9 + 8));
          InsertUnique((KeyMapBase<unsigned_int> *)pUVar15,mVar5,(KeyNode *)psVar9);
          psVar9 = psVar13;
        } while (psVar13 != (string *)0x0);
        return extraout_EAX_02;
      }
      Resize();
      uVar6 = extraout_EAX_01;
    }
    return uVar6;
  }
  puVar14 = (ulong *)(this_00->super_UntypedMapBase).table_[uVar11];
  mVar5 = (map_index_t)CONCAT71((uint7)(uint3)(uVar11 >> 8),1);
  if (puVar14 != extraout_RDX) {
    if (((ulong)puVar14 & 1) == 0 && puVar14 != (ulong *)0x0) {
      do {
        puVar14 = (ulong *)*puVar14;
        if (puVar14 == extraout_RDX) break;
      } while (puVar14 != (ulong *)0x0);
      if (puVar14 != (ulong *)0x0) {
        return mVar5;
      }
    }
    uStack_90 = 0x16011b;
    NVar17 = FindHelper(this_00,(ViewType)extraout_RDX[1],it);
    *(map_index_t *)psVar9 = NVar17.bucket;
    pTVar16 = (this_00->super_UntypedMapBase).table_;
    mVar5 = (map_index_t)CONCAT71((int7)((ulong)pTVar16 >> 8),(pTVar16[NVar17.bucket] & 1) == 0);
  }
  return mVar5;
}

Assistant:

map_index_t BucketNumber(typename TS::ViewType k) const {
    ABSL_DCHECK_EQ(
        VariantBucketNumber(RealKeyToVariantKeyAlternative<Key>{}(k)),
        VariantBucketNumber(RealKeyToVariantKey<Key>{}(k)));
    return VariantBucketNumber(RealKeyToVariantKeyAlternative<Key>{}(k));
  }